

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_graph.cpp
# Opt level: O3

void __thiscall indigox::ElectronGraph::ElectronGraph(ElectronGraph *this,MolecularGraph *G)

{
  StoredVertexList *pSVar1;
  Atom *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  MolEdge e;
  AdjList *g;
  element_type *peVar7;
  VertType pvVar8;
  MolecularGraph *pMVar9;
  long *plVar10;
  element_type *peVar11;
  unordered_map<void_*,_void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_void_*>_>_>
  mol2eln;
  ElnVertProp local_c0;
  long local_a0;
  MolecularGraph *local_98;
  _Hash_node_base *local_80;
  _Hash_node_base *p_Stack_78;
  _List_node_base **local_70;
  _Hashtable<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  utils::Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
  Graph(&this->super__ElnGraph);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  peVar7 = (G->super__MolGraph).graph_.
           super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pSVar1 = &(peVar7->super_type).m_vertices;
  plVar10 = *(long **)&(peVar7->super_type).m_vertices.
                       super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node;
  if ((StoredVertexList *)plVar10 != pSVar1) {
    do {
      local_c0.id.first = (void *)plVar10[2];
      this_00 = (Atom *)((_Hash_node_base *)((long)local_c0.id.first + 0x30))->_M_nxt;
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((_Hash_node_base *)((long)local_c0.id.first + 0x38))->_M_nxt;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
          local_c0.id.first = (void *)plVar10[2];
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      local_c0.id.second = local_c0.id.first;
      Atom::GetElement(this_00);
      local_c0.electronegativity = *(float *)(local_a0 + 0x58);
      if (local_98 != (MolecularGraph *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98);
      }
      Atom::GetElement(this_00);
      local_c0.valence = *(uint8_t *)(local_a0 + 0x43);
      if (local_98 != (MolecularGraph *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98);
      }
      Atom::GetElement(this_00);
      local_c0.atomic_number = *(uint8_t *)(local_a0 + 0x42);
      pMVar9 = local_98;
      if (local_98 != (MolecularGraph *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98);
      }
      local_c0.electron_count = '\0';
      local_c0.pre_placed = PreplaceCount(pMVar9,(MolVertex)plVar10[2]);
      Atom::GetElement(this_00);
      local_c0.target_octet = *(uint8_t *)(local_a0 + 0x44);
      if (local_98 != (MolecularGraph *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98);
      }
      Atom::GetElement(this_00);
      local_c0.target_hyper_octet = *(uint8_t *)(local_a0 + 0x45);
      if (local_98 != (MolecularGraph *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98);
      }
      local_c0.formal_charge = '\0';
      local_98 = (MolecularGraph *)
                 utils::
                 Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                 ::AddVertex(&this->super__ElnGraph,&local_c0);
      local_a0 = plVar10[2];
      std::
      _Hashtable<void*,std::pair<void*const,void*>,std::allocator<std::pair<void*const,void*>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<void*,void*>>
                ((_Hashtable<void*,std::pair<void*const,void*>,std::allocator<std::pair<void*const,void*>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_68,&local_a0);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      plVar10 = (long *)*plVar10;
    } while ((StoredVertexList *)plVar10 != pSVar1);
    peVar7 = (G->super__MolGraph).graph_.
             super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  }
  peVar11 = *(element_type **)
             &(peVar7->super_type).m_edges.
              super__List_base<boost::list_edge<void_*,_indigox::MolEdgeProp>,_std::allocator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>_>
  ;
  if (peVar11 != peVar7) {
    do {
      p_Var2 = *(_Hash_node_base **)
                ((long)&(peVar11->super_type).m_edges.
                        super__List_base<boost::list_edge<void_*,_indigox::MolEdgeProp>,_std::allocator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>_>
                + 0x10);
      if (local_68._M_buckets[(ulong)p_Var2 % local_68._M_bucket_count] == (__node_base_ptr)0x0) {
LAB_001261f2:
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var3 = *(_Hash_node_base **)
                &(peVar11->super_type).m_vertices.super__List_base<void_*,_std::allocator<void_*>_>.
                 _M_impl._M_node;
      p_Var4 = local_68._M_buckets[(ulong)p_Var2 % local_68._M_bucket_count]->_M_nxt;
      p_Var5 = p_Var4[1]._M_nxt;
      while (p_Var2 != p_Var5) {
        p_Var4 = p_Var4->_M_nxt;
        if ((p_Var4 == (_Hash_node_base *)0x0) ||
           (p_Var5 = p_Var4[1]._M_nxt,
           (ulong)p_Var5 % local_68._M_bucket_count != (ulong)p_Var2 % local_68._M_bucket_count))
        goto LAB_001261f2;
      }
      pMVar9 = (MolecularGraph *)((ulong)p_Var3 % local_68._M_bucket_count);
      if (local_68._M_buckets[(long)pMVar9] == (__node_base_ptr)0x0) {
LAB_001261fe:
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var4 = p_Var4[2]._M_nxt;
      p_Var5 = local_68._M_buckets[(long)pMVar9]->_M_nxt;
      p_Var6 = p_Var5[1]._M_nxt;
      while (p_Var3 != p_Var6) {
        p_Var5 = p_Var5->_M_nxt;
        if ((p_Var5 == (_Hash_node_base *)0x0) ||
           (p_Var6 = p_Var5[1]._M_nxt,
           (MolecularGraph *)((ulong)p_Var6 % local_68._M_bucket_count) != pMVar9))
        goto LAB_001261fe;
      }
      local_c0.id.second = p_Var2;
      local_c0.id.first = p_Var3;
      if (p_Var2 < p_Var3) {
        local_c0.id.second = p_Var3;
        local_c0.id.first = p_Var2;
      }
      p_Var5 = p_Var5[2]._M_nxt;
      local_c0.electron_count = '\0';
      local_70 = (_List_node_base **)
                 ((long)&(peVar11->super_type).m_vertices.
                         super__List_base<void_*,_std::allocator<void_*>_> + 8);
      e.super_edge_base<boost::undirected_tag,_void_*>.m_target = p_Var3;
      e.super_edge_base<boost::undirected_tag,_void_*>.m_source = p_Var2;
      e.m_eproperty = local_70;
      local_80 = p_Var2;
      p_Stack_78 = p_Var3;
      local_c0.pre_placed = PreplaceCount(pMVar9,e);
      pvVar8 = utils::
               Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
               ::AddVertex(&this->super__ElnGraph,&local_c0);
      utils::
      Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
      AddEdge(&local_a0,&this->super__ElnGraph,p_Var4,pvVar8);
      utils::
      Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
      AddEdge(&local_a0,&this->super__ElnGraph,p_Var5,pvVar8);
      peVar11 = *(element_type **)
                 &(peVar11->super_type).m_edges.
                  super__List_base<boost::list_edge<void_*,_indigox::MolEdgeProp>,_std::allocator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>_>
      ;
    } while (peVar11 != peVar7);
  }
  std::
  _Hashtable<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

ElectronGraph::ElectronGraph(const MolecularGraph &G)
  : _ElnGraph()
  {
    using namespace std;
    unordered_map<MolVertex, ElnVertex> mol2eln;
    MolVertIterPair vertices = G.GetVertices();
    uint16_t count = 0;
    for (MolVertexIter b = vertices.first; b != vertices.second; ++b) {
      MolVertProp prop = *G.GetProperties(*b);
      ElnVertProp e_prop;
      e_prop.id = make_pair(*b, *b);
      count++;
      e_prop.electronegativity = prop.atom->GetElement()->GetElectronegativity();
      e_prop.valence = prop.atom->GetElement()->GetValenceElectronCount();
      e_prop.atomic_number = prop.atom->GetElement()->GetAtomicNumber();
      e_prop.electron_count = 0;
      e_prop.pre_placed = PreplaceCount(G, *b);
      e_prop.target_octet = prop.atom->GetElement()->GetOctet();
      e_prop.target_hyper_octet = prop.atom->GetElement()->GetHypervalentOctet();
      e_prop.formal_charge = 0;
      
      
      ElnVertex e_vert = AddVertex(e_prop);
      mol2eln.insert(make_pair(*b, e_vert));
    }
    
    MolEdgeIterPair edges = G.GetEdges();
    for (MolEdgeIter b = edges.first; b != edges.second; ++b) {
      MolVertex u = G.GetSource(*b), v = G.GetTarget(*b);
      ElnVertex u_eln = mol2eln.at(u), v_eln = mol2eln.at(v);
      ElnVertProp e_prop;
      if (u < v)
        e_prop.id = make_pair(u, v);
      else
        e_prop.id = make_pair(v, u);
      e_prop.electron_count = 0;
      e_prop.pre_placed = PreplaceCount(G, *b);
      ElnVertex e_vert = AddVertex(e_prop);
      AddEdge(u_eln, e_vert);
      AddEdge(v_eln, e_vert);
    }
  }